

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::storage_moved_alert::~storage_moved_alert(storage_moved_alert *this)

{
  storage_moved_alert *this_local;
  
  ~storage_moved_alert(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

struct TORRENT_EXPORT storage_moved_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT storage_moved_alert(aux::stack_allocator& alloc
			, torrent_handle const& h, string_view p, string_view old);

		TORRENT_DEFINE_ALERT_PRIO(storage_moved_alert, 33, alert_priority::critical)

		static inline constexpr alert_category_t static_category = alert_category::storage;
		std::string message() const override;

		// the path the torrent was moved to and from, respectively.
		char const* storage_path() const;
		char const* old_path() const;

	private:
		aux::allocation_slot m_path_idx;
		aux::allocation_slot m_old_path_idx;
#if TORRENT_ABI_VERSION == 1
	public:
		TORRENT_DEPRECATED std::string path;
#endif
	}